

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O2

void __thiscall
TasGrid::GridLocalPolynomial::applyTransformationTransposed<0,(TasGrid::RuleLocal::erule)2>
          (GridLocalPolynomial *this,double *weights,MultiIndexSet *work,
          vector<int,_std::allocator<int>_> *active_points)

{
  pointer piVar1;
  size_t sVar2;
  pointer piVar3;
  Data2D<int> *pDVar4;
  MultiIndexSet *pMVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  Data2D<int> *pDVar9;
  int iVar10;
  long lVar11;
  size_type sVar12;
  int j;
  long lVar13;
  vector<int,_std::allocator<int>_> *pvVar14;
  size_t i;
  ulong uVar15;
  int j_1;
  uint uVar16;
  ulong uVar17;
  double dVar18;
  double dVar19;
  reference rVar20;
  _Bit_iterator __first;
  _Bit_iterator __last;
  allocator_type local_125;
  int local_124;
  int local_120;
  int local_11c;
  MultiIndexSet *local_118;
  vector<int,_std::allocator<int>_> *local_110;
  size_type local_108;
  vector<double,_std::allocator<double>_> node;
  vector<bool,_std::allocator<bool>_> used;
  vector<int,_std::allocator<int>_> monkey_tail;
  vector<int,_std::allocator<int>_> monkey_count;
  vector<int,_std::allocator<int>_> level;
  Data2D<int> lparents;
  
  local_124 = (int)(this->parents).num_strips;
  if (work->cache_num_indexes == local_124) {
    lparents.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    lparents.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    lparents.stride = 0;
    lparents.num_strips = 0;
    lparents.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_120 = local_124;
  }
  else {
    HierarchyManipulations::computeDAGup<(TasGrid::RuleLocal::erule)2>(&lparents,work);
    local_120 = (int)(this->parents).num_strips;
    local_124 = work->cache_num_indexes;
  }
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&level,
             (long)(active_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(active_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2,(allocator_type *)&used);
  iVar10 = 0;
  local_118 = work;
  local_110 = active_points;
  for (uVar15 = 0; pvVar14 = local_110, pMVar5 = local_118,
      piVar1 = (local_110->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar15 < (ulong)((long)(local_110->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)piVar1 >> 2);
      uVar15 = uVar15 + 1) {
    piVar8 = (local_118->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + (long)piVar1[uVar15] * local_118->num_dimensions;
    iVar6 = RuleLocal::getLevel<(TasGrid::RuleLocal::erule)2>(*piVar8);
    for (lVar13 = 1; lVar13 < (this->super_BaseCanonicalGrid).num_dimensions; lVar13 = lVar13 + 1) {
      iVar7 = RuleLocal::getLevel<(TasGrid::RuleLocal::erule)2>(piVar8[lVar13]);
      iVar6 = iVar6 + iVar7;
    }
    if (iVar10 <= iVar6) {
      iVar10 = iVar6;
    }
    level.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [uVar15] = iVar6;
  }
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&monkey_count,(long)this->top_level + 1,
             (allocator_type *)&used);
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&monkey_tail,(long)this->top_level + 1,
             (allocator_type *)&used);
  ::std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&used,(long)pMVar5->cache_num_indexes,
             (allocator_type *)&node);
  iVar6 = (this->super_BaseCanonicalGrid).num_dimensions;
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&node,(long)iVar6,&local_125);
  do {
    if (iVar10 < 1) {
      ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&node);
      ::std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                ((_Bvector_base<std::allocator<bool>_> *)&used);
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&monkey_tail);
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&monkey_count);
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&level);
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&lparents.vec.super__Vector_base<int,_std::allocator<int>_>);
      return;
    }
    local_11c = iVar10;
    for (uVar15 = 0;
        piVar1 = (pvVar14->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start,
        uVar15 < (ulong)((long)(pvVar14->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_finish - (long)piVar1 >> 2);
        uVar15 = uVar15 + 1) {
      if (level.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar15] == iVar10) {
        iVar10 = piVar1[uVar15];
        sVar2 = local_118->num_dimensions;
        piVar3 = (local_118->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (lVar13 = 0; lVar13 < (this->super_BaseCanonicalGrid).num_dimensions;
            lVar13 = lVar13 + 1) {
          dVar18 = RuleLocal::getNode<(TasGrid::RuleLocal::erule)2>
                             (piVar3[(long)iVar10 * sVar2 + lVar13]);
          node.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar13] = dVar18;
        }
        local_125 = (allocator_type)0x0;
        __first.super__Bit_iterator_base._8_8_ = 0;
        __first.super__Bit_iterator_base._M_p =
             used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p;
        __last.super__Bit_iterator_base._12_4_ = 0;
        __last.super__Bit_iterator_base._M_p =
             used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p;
        __last.super__Bit_iterator_base._M_offset =
             used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset;
        std::__fill_a1(__first,__last,(bool *)&local_125);
        *monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start = 0;
        *monkey_tail.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start = (pvVar14->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar15];
        uVar17 = 0;
        piVar8 = monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar10 = local_11c;
        do {
          uVar17 = (ulong)(int)uVar17;
          while( true ) {
            if (SBORROW4(*piVar8,iVar6 * 2) == *piVar8 + iVar6 * -2 < 0) goto LAB_001a3b0a;
            iVar7 = piVar8[uVar17];
            if (SBORROW4(iVar7,iVar6 * 2) != iVar7 + iVar6 * -2 < 0) break;
            uVar17 = uVar17 - 1;
            piVar8[(int)uVar17] = piVar8[(int)uVar17] + 1;
          }
          pDVar9 = &lparents;
          if (local_124 == local_120) {
            pDVar9 = &this->parents;
          }
          pDVar4 = &lparents;
          if (local_124 == local_120) {
            pDVar4 = &this->parents;
          }
          sVar12 = (size_type)
                   (pDVar4->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [(long)monkey_tail.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar17] * pDVar9->stride + (long)iVar7];
          if ((sVar12 == 0xffffffffffffffff) ||
             (local_108 = sVar12,
             rVar20 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                                ((vector<bool,_std::allocator<bool>_> *)&used,sVar12),
             piVar8 = monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start, (*rVar20._M_p & rVar20._M_mask) != 0)) {
            piVar8[uVar17] = piVar8[uVar17] + 1;
          }
          else {
            lVar11 = local_118->num_dimensions * local_108;
            piVar3 = (local_118->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            dVar18 = RuleLocal::evalRaw<(TasGrid::RuleLocal::erule)2>
                               (this->order,piVar3[lVar11],
                                *node.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start);
            for (lVar13 = 1; sVar12 = local_108, pvVar14 = local_110,
                lVar13 < (this->super_BaseCanonicalGrid).num_dimensions; lVar13 = lVar13 + 1) {
              dVar19 = RuleLocal::evalRaw<(TasGrid::RuleLocal::erule)2>
                                 (this->order,piVar3[lVar11 + lVar13],
                                  node.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start[lVar13]);
              dVar18 = dVar18 * dVar19;
            }
            weights[local_108] =
                 weights[local_108] -
                 dVar18 * weights[(local_110->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                  .super__Vector_impl_data._M_start[uVar15]];
            rVar20 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)&used,local_108);
            *rVar20._M_p = *rVar20._M_p | rVar20._M_mask;
            uVar16 = (int)uVar17 + 1;
            uVar17 = (ulong)uVar16;
            monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(int)uVar16] = 0;
            monkey_tail.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(int)uVar16] = (int)sVar12;
            piVar8 = monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar10 = local_11c;
          }
        } while( true );
      }
LAB_001a3b0a:
    }
    iVar10 = iVar10 + -1;
  } while( true );
}

Assistant:

void GridLocalPolynomial::applyTransformationTransposed(double weights[], const MultiIndexSet &work, const std::vector<int> &active_points) const {
    Data2D<int> lparents = (parents.getNumStrips() != work.getNumIndexes()) ? // if the current dag loaded in parents does not reflect the indexes in work
                            HierarchyManipulations::computeDAGup<effrule>(work) :
                            Data2D<int>();

    const Data2D<int> &dagUp = (parents.getNumStrips() != work.getNumIndexes()) ? lparents : parents;

    std::vector<int> level(active_points.size());
    int active_top_level = 0;
    for(size_t i=0; i<active_points.size(); i++){
        const int *p = work.getIndex(active_points[i]);
        int current_level = RuleLocal::getLevel<effrule>(p[0]);
        for(int j=1; j<num_dimensions; j++){
            current_level += RuleLocal::getLevel<effrule>(p[j]);
        }
        if (active_top_level < current_level) active_top_level = current_level;
        level[i] = current_level;
    }

    std::vector<int> monkey_count(top_level+1);
    std::vector<int> monkey_tail(top_level+1);
    std::vector<bool> used(work.getNumIndexes());
    int max_parents = RuleLocal::getMaxNumParents<effrule>() * num_dimensions;

    std::vector<double> node(num_dimensions);

    for(int l=active_top_level; l>0; l--){
        for(size_t i=0; i<active_points.size(); i++){
            if (level[i] == l){
                int const *pnt = work.getIndex(active_points[i]);
                for(int j=0; j<num_dimensions; j++)
                    node[j] = RuleLocal::getNode<effrule>(pnt[j]);

                std::fill(used.begin(), used.end(), false);

                monkey_count[0] = 0;
                monkey_tail[0] = active_points[i];
                int current = 0;

                while(monkey_count[0] < max_parents){
                    if (monkey_count[current] < max_parents){
                        int branch = dagUp.getStrip(monkey_tail[current])[monkey_count[current]];
                        if ((branch == -1) || used[branch]){
                            monkey_count[current]++;
                        }else{
                            const int *func = work.getIndex(branch);
                            double basis_value = RuleLocal::evalRaw<effrule>(order, func[0], node[0]);
                            for(int j=1; j<num_dimensions; j++) basis_value *= RuleLocal::evalRaw<effrule>(order, func[j], node[j]);

                            if (mode == 0) {
                                weights[branch] -= weights[active_points[i]] * basis_value;
                            } else {
                                for (int d=0; d<num_dimensions; d++)
                                    weights[branch * num_dimensions + d] -=
                                            weights[active_points[i] * num_dimensions + d] * basis_value;
                            }
                            used[branch] = true;

                            monkey_count[++current] = 0;
                            monkey_tail[current] = branch;
                        }
                    }else{
                        monkey_count[--current]++;
                    }
                }
            }
        }
    }
}